

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.cpp
# Opt level: O3

bool __thiscall index::find_character(index *this,wchar_t key,wchar_t value,character *ch)

{
  _Node_iterator_base<std::pair<const_wchar_t,_character>,_false> _Var1;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_wchar_t,_character>,_false,_false>_>
  pVar2;
  key_type local_14;
  
  pVar2 = std::
          _Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
          ::equal_range((_Hashtable<wchar_t,_std::pair<const_wchar_t,_character>,_std::allocator<std::pair<const_wchar_t,_character>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                         *)this,&local_14);
  _Var1._M_cur = (__node_type *)
                 pVar2.first.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>.
                 _M_cur;
  while( true ) {
    if ((_Node_iterator_base<std::pair<const_wchar_t,_character>,_false>)_Var1._M_cur ==
        pVar2.second.super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>._M_cur.
        super__Node_iterator_base<std::pair<const_wchar_t,_character>,_false>) {
      return false;
    }
    if (*(wchar_t *)
         ((long)&((_Var1._M_cur)->super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>
                 ).super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage.
                 _M_storage + 8) == value) break;
    _Var1._M_cur = (__node_type *)((_Var1._M_cur)->super__Hash_node_base)._M_nxt;
  }
  ch->is_word_end =
       (bool)((_Var1._M_cur)->super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>).
             super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage._M_storage
             .__data[0xc];
  ch->value = *(wchar_t *)
               ((long)&((_Var1._M_cur)->
                       super__Hash_node_value<std::pair<const_wchar_t,_character>,_false>).
                       super__Hash_node_value_base<std::pair<const_wchar_t,_character>_>._M_storage.
                       _M_storage + 8);
  std::__cxx11::wstring::_M_assign((wstring *)&ch->word);
  return true;
}

Assistant:

bool index::find_character(wchar_t key, wchar_t value, character& ch)
{
    auto range = index_.equal_range(key);
    for (auto iter = range.first; iter != range.second; ++iter)
    {
        if (iter->second.value == value)
        {
            ch = iter->second;
            return true;
        }
    }
    return false;
}